

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O0

void Aig_ManFanoutStart(Aig_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManBufNum(p);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                  ,0x3c,"void Aig_ManFanoutStart(Aig_Man_t *)");
  }
  if (p->pFanData == (int *)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    p->nFansAlloc = iVar1 << 1;
    if (p->nFansAlloc < 0x1000) {
      p->nFansAlloc = 0x1000;
    }
    piVar2 = (int *)malloc((long)(p->nFansAlloc * 5) << 2);
    p->pFanData = piVar2;
    memset(p->pFanData,0,(long)p->nFansAlloc * 0x14);
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
      if (pObj_00 != (Aig_Obj_t *)0x0) {
        pAVar3 = Aig_ObjChild0(pObj_00);
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          pAVar3 = Aig_ObjFanin0(pObj_00);
          Aig_ObjAddFanout(p,pAVar3,pObj_00);
        }
        pAVar3 = Aig_ObjChild1(pObj_00);
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          pAVar3 = Aig_ObjFanin1(pObj_00);
          Aig_ObjAddFanout(p,pAVar3,pObj_00);
        }
      }
    }
    return;
  }
  __assert_fail("p->pFanData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                ,0x3e,"void Aig_ManFanoutStart(Aig_Man_t *)");
}

Assistant:

void Aig_ManFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
}